

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O0

uint RDL_tarjan(RDL_graph *graph,uint **bcc)

{
  void *pvVar1;
  RDL_stack *stack;
  RDL_stack *edge_stack;
  uint i;
  uint curr_bcc;
  uint time;
  uint u;
  uint *low;
  uint *d;
  uint **bcc_local;
  RDL_graph *graph_local;
  
  d = (uint *)bcc;
  bcc_local = (uint **)graph;
  low = (uint *)malloc((ulong)graph->V << 2);
  _time = (uint *)malloc((ulong)*(uint *)bcc_local << 2);
  pvVar1 = malloc((ulong)*(uint *)((long)bcc_local + 4) << 2);
  *(void **)d = pvVar1;
  for (edge_stack._0_4_ = 0; (uint)edge_stack < *(uint *)((long)bcc_local + 4);
      edge_stack._0_4_ = (uint)edge_stack + 1) {
    *(undefined4 *)(*(long *)d + (ulong)(uint)edge_stack * 4) = 0;
  }
  stack = RDL_stack_new();
  i = 0;
  edge_stack._4_4_ = 1;
  for (curr_bcc = 0; curr_bcc < *(uint *)bcc_local; curr_bcc = curr_bcc + 1) {
    low[curr_bcc] = 0;
    _time[curr_bcc] = 0;
  }
  for (curr_bcc = 0; curr_bcc < *(uint *)bcc_local; curr_bcc = curr_bcc + 1) {
    if (low[curr_bcc] == 0) {
      RDL_tarjanVisit((RDL_graph *)bcc_local,curr_bcc,low,_time,&i,(uint *)((long)&edge_stack + 4),
                      *(uint **)d,stack);
    }
  }
  free(low);
  free(_time);
  RDL_stack_delete(stack);
  return edge_stack._4_4_ - 1;
}

Assistant:

static unsigned RDL_tarjan(const RDL_graph* graph,
                    unsigned** bcc)
{
  unsigned *d, *low, u, time, curr_bcc, i;
  RDL_stack* edge_stack;

  d = malloc(graph->V * sizeof(*d));
  low = malloc(graph->V * sizeof(*low));
  *bcc = malloc(graph->E * sizeof(**bcc));
  for (i = 0; i < graph->E; ++i) {
    (*bcc)[i] = 0;
  }

  edge_stack = RDL_stack_new();

  time = 0;
  curr_bcc = 1;

  for (u = 0; u < graph->V; ++u) {
    d[u] = 0;
    low[u] = 0;
  }

  for (u = 0; u < graph->V; ++u) {
    if (d[u] == 0) {
      RDL_tarjanVisit(graph, u, d, low, &time, &curr_bcc, *bcc, edge_stack);
    }
  }

  free(d);
  free(low);

  RDL_stack_delete(edge_stack);

  return (curr_bcc-1);
}